

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

TagState * __thiscall
despot::MemoryPool<despot::TagState>::Allocate(MemoryPool<despot::TagState> *this)

{
  TagState *pTVar1;
  pointer ppTVar2;
  
  ppTVar2 = (this->freelist_).
            super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->freelist_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
      _M_impl.super__Vector_impl_data._M_start == ppTVar2) {
    NewChunk(this);
    ppTVar2 = (this->freelist_).
              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pTVar1 = ppTVar2[-1];
  (this->freelist_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppTVar2 + -1;
  if (pTVar1->field_0x8 != '\x01') {
    pTVar1->field_0x8 = 1;
    this->num_allocated_ = this->num_allocated_ + 1;
    return pTVar1;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,"T *despot::MemoryPool<despot::TagState>::Allocate() [T = despot::TagState]");
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}